

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O2

pair<unsigned_long,_float> __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>::_Pool::
Release(_Pool *this,
       Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
       *pNode)

{
  Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_> *pNVar1
  ;
  undefined8 uVar2;
  undefined4 uVar3;
  pair<unsigned_long,_float> pVar4;
  
  uVar2 = (pNode->_value).first;
  uVar3 = (pNode->_value).second;
  pVar4.second = (float)uVar3;
  pVar4.first = uVar2;
  pNVar1 = this->cache;
  this->cache = pNode;
  if (pNVar1 != (Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                 *)0x0) {
    std::
    _Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
    ::~_Vector_base((_Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
                     *)&pNVar1->_nodeRefs);
  }
  operator_delete(pNVar1);
  pVar4._12_4_ = 0;
  return pVar4;
}

Assistant:

T Release(Node *pNode) {
			T result = pNode->value();
			std::swap(pNode, cache);
			delete pNode;
			return result;
		}